

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

void __thiscall
CVmObjStringBuffer::restore_from_file
          (CVmObjStringBuffer *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  int iVar1;
  vm_strbuf_ext *pvVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  wchar_t *pwVar6;
  char buf [512];
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  CVmFile::read_bytes(fp,buf,0xc);
  pvVar2 = vm_strbuf_ext::alloc_ext(this,buf._0_4_,buf._4_4_);
  (this->super_CVmObject).ext_ = (char *)pvVar2;
  if ((int)buf._8_4_ < (int)buf._0_4_) {
    buf._0_4_ = buf._8_4_;
  }
  pvVar2->len = buf._0_4_;
  pwVar6 = pvVar2->buf;
  for (iVar4 = buf._0_4_; iVar4 != 0; iVar4 = iVar4 - iVar5) {
    iVar5 = 0x100;
    if (iVar4 < 0x100) {
      iVar5 = iVar4;
    }
    CVmFile::read_bytes(fp,buf,(long)iVar5 * 2);
    iVar1 = iVar4;
    if (0xff < iVar4) {
      iVar1 = 0x100;
    }
    for (lVar3 = 0; iVar1 != (int)lVar3; lVar3 = lVar3 + 1) {
      *pwVar6 = (uint)*(ushort *)(buf + lVar3 * 2);
      pwVar6 = pwVar6 + 1;
    }
  }
  return;
}

Assistant:

void CVmObjStringBuffer::restore_from_file(VMG_ vm_obj_id_t self,
                                           CVmFile *fp, CVmObjFixup *fixups)
{
    const int32_t bufchars = 256;
    char buf[bufchars * sizeof(uint16_t)];
    
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the fixed fields */
    fp->read_bytes(buf, 12);
    int32_t alo = vmb_get_int4(buf);
    int32_t inc = vmb_get_int4(buf + 4);
    int32_t len = vmb_get_int4(buf + 8);

    /* allocate the extension structure */
    vm_strbuf_ext *ext = vm_strbuf_ext::alloc_ext(vmg_ this, alo, inc);
    ext_ = (char *)ext;

    /* limit the length */
    if (len > alo)
        len = alo;

    /* store it in the extension */
    ext->len = len;

    /* read the string contents */
    wchar_t *dst;
    int32_t rem;
    for (dst = ext->buf, rem = len ; rem != 0 ; )
    {
        /* read one buffer-full, or 'rem', whichever is less */
        int32_t cur = rem > bufchars ? bufchars : rem;
        fp->read_bytes(buf, cur * sizeof(uint16_t));

        /* deduct this read from the total */
        rem -= cur;

        /* decode the characters */
        for (const char *src = buf ; cur != 0 ;
             *dst++ = osrp2(src), src += 2, --cur) ;
    }
}